

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long mkvparser::VideoTrack::Parse
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               VideoTrack **pResult)

{
  bool bVar1;
  int iVar2;
  long stop_00;
  VideoTrack *this;
  pointer pCVar3;
  pointer pPVar4;
  VideoTrack *local_160;
  int status;
  VideoTrack *pTrack;
  long status_3;
  Projection *projection;
  Colour *colour;
  long status_2;
  Segment *local_c0;
  long status_1;
  longlong size;
  longlong id;
  unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> projection_ptr;
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> colour_ptr;
  longlong stop;
  longlong pos;
  Settings *s;
  IMkvReader *pReader;
  char *colour_space;
  double rate;
  longlong stereo_mode;
  longlong display_unit;
  longlong display_height;
  longlong display_width;
  longlong height;
  longlong width;
  VideoTrack **pResult_local;
  longlong element_size_local;
  longlong element_start_local;
  Info *info_local;
  Segment *pSegment_local;
  
  if (*pResult == (VideoTrack *)0x0) {
    if (info->type == 1) {
      height = 0;
      display_width = 0;
      display_height = 0;
      display_unit = 0;
      stereo_mode = 0;
      rate = 0.0;
      colour_space = (char *)0x0;
      pReader = (IMkvReader *)0x0;
      s = (Settings *)pSegment->m_pReader;
      pos = (longlong)&info->settings;
      width = (longlong)pResult;
      pResult_local = (VideoTrack **)element_size;
      element_size_local = element_start;
      element_start_local = (longlong)info;
      info_local = (Info *)pSegment;
      if (((Settings *)pos)->start < 0) {
        __assert_fail("s.start >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x14cf,
                      "static long mkvparser::VideoTrack::Parse(Segment *, const Info &, long long, long long, VideoTrack *&)"
                     );
      }
      if ((info->settings).size < 0) {
        __assert_fail("s.size >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x14d0,
                      "static long mkvparser::VideoTrack::Parse(Segment *, const Info &, long long, long long, VideoTrack *&)"
                     );
      }
      stop = ((Settings *)pos)->start;
      if (stop < 0) {
        __assert_fail("pos >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x14d3,
                      "static long mkvparser::VideoTrack::Parse(Segment *, const Info &, long long, long long, VideoTrack *&)"
                     );
      }
      stop_00 = stop + (info->settings).size;
      std::unique_ptr<mkvparser::Colour,std::default_delete<mkvparser::Colour>>::
      unique_ptr<std::default_delete<mkvparser::Colour>,void>
                ((unique_ptr<mkvparser::Colour,std::default_delete<mkvparser::Colour>> *)
                 &projection_ptr);
      std::unique_ptr<mkvparser::Projection,std::default_delete<mkvparser::Projection>>::
      unique_ptr<std::default_delete<mkvparser::Projection>,void>
                ((unique_ptr<mkvparser::Projection,std::default_delete<mkvparser::Projection>> *)&id
                );
      do {
        if (stop_00 <= stop) {
          if (stop == stop_00) {
            this = (VideoTrack *)operator_new(0x110,(nothrow_t *)&std::nothrow);
            local_160 = (VideoTrack *)0x0;
            if (this != (VideoTrack *)0x0) {
              VideoTrack(this,(Segment *)info_local,element_size_local,(longlong)pResult_local);
              local_160 = this;
            }
            if (local_160 == (VideoTrack *)0x0) {
              pSegment_local = (Segment *)0xffffffffffffffff;
            }
            else {
              iVar2 = Track::Info::Copy((Info *)element_start_local,&(local_160->super_Track).m_info
                                       );
              if (iVar2 == 0) {
                local_160->m_width = height;
                local_160->m_height = display_width;
                local_160->m_display_width = display_height;
                local_160->m_display_height = display_unit;
                local_160->m_display_unit = stereo_mode;
                local_160->m_stereo_mode = (longlong)rate;
                local_160->m_rate = (double)colour_space;
                pCVar3 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                         ::release((unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                                    *)&projection_ptr);
                local_160->m_colour = pCVar3;
                local_160->m_colour_space = (char *)pReader;
                pPVar4 = std::
                         unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                         ::release((unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                                    *)&id);
                local_160->m_projection = pPVar4;
                *(VideoTrack **)width = local_160;
                pSegment_local = (Segment *)0x0;
              }
              else {
                if (local_160 != (VideoTrack *)0x0) {
                  (*(local_160->super_Track)._vptr_Track[1])();
                }
                pSegment_local = (Segment *)(long)iVar2;
              }
            }
          }
          else {
            pSegment_local = (Segment *)0xfffffffffffffffe;
          }
          goto LAB_0012dceb;
        }
        local_c0 = (Segment *)ParseElementHeader((IMkvReader *)s,&stop,stop_00,&size,&status_1);
        pSegment_local = local_c0;
        if ((long)local_c0 < 0) goto LAB_0012dceb;
        if (size == 0xb0) {
          height = UnserializeUInt((IMkvReader *)s,stop,status_1);
          if (height < 1) {
            pSegment_local = (Segment *)0xfffffffffffffffe;
            goto LAB_0012dceb;
          }
        }
        else if (size == 0xba) {
          display_width = UnserializeUInt((IMkvReader *)s,stop,status_1);
          if (display_width < 1) {
            pSegment_local = (Segment *)0xfffffffffffffffe;
            goto LAB_0012dceb;
          }
        }
        else if (size == 0x54b0) {
          display_height = UnserializeUInt((IMkvReader *)s,stop,status_1);
          if (display_height < 1) {
            pSegment_local = (Segment *)0xfffffffffffffffe;
            goto LAB_0012dceb;
          }
        }
        else if (size == 0x54ba) {
          display_unit = UnserializeUInt((IMkvReader *)s,stop,status_1);
          if (display_unit < 1) {
            pSegment_local = (Segment *)0xfffffffffffffffe;
            goto LAB_0012dceb;
          }
        }
        else if (size == 0x54b2) {
          stereo_mode = UnserializeUInt((IMkvReader *)s,stop,status_1);
          if (stereo_mode < 0) {
            pSegment_local = (Segment *)0xfffffffffffffffe;
            goto LAB_0012dceb;
          }
        }
        else if (size == 0x53b8) {
          rate = (double)UnserializeUInt((IMkvReader *)s,stop,status_1);
          if ((long)rate < 0) {
            pSegment_local = (Segment *)0xfffffffffffffffe;
            goto LAB_0012dceb;
          }
        }
        else if (size == 0x2383e3) {
          colour = (Colour *)UnserializeFloat((IMkvReader *)s,stop,status_1,(double *)&colour_space)
          ;
          pSegment_local = (Segment *)colour;
          if ((long)colour < 0) goto LAB_0012dceb;
          if ((double)colour_space <= 0.0) {
            pSegment_local = (Segment *)0xfffffffffffffffe;
            goto LAB_0012dceb;
          }
        }
        else if (size == 0x55b0) {
          projection = (Projection *)0x0;
          bVar1 = Colour::Parse((IMkvReader *)s,stop,status_1,(Colour **)&projection);
          if (!bVar1) {
            pSegment_local = (Segment *)0xfffffffffffffffe;
            goto LAB_0012dceb;
          }
          std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::reset
                    ((unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> *)
                     &projection_ptr,(pointer)projection);
        }
        else if (size == 0x7670) {
          status_3 = 0;
          bVar1 = Projection::Parse((IMkvReader *)s,stop,status_1,(Projection **)&status_3);
          if (!bVar1) {
            pSegment_local = (Segment *)0xfffffffffffffffe;
            goto LAB_0012dceb;
          }
          std::unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::reset
                    ((unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                      *)&id,(pointer)status_3);
        }
        else if ((size == 0x2eb524) &&
                (pSegment_local =
                      (Segment *)UnserializeString((IMkvReader *)s,stop,status_1,(char **)&pReader),
                (long)pSegment_local < 0)) goto LAB_0012dceb;
        stop = status_1 + stop;
      } while (stop <= stop_00);
      pSegment_local = (Segment *)0xfffffffffffffffe;
LAB_0012dceb:
      status_2._0_4_ = 1;
      std::unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
      ~unique_ptr((unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> *)
                  &id);
      std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::~unique_ptr
                ((unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> *)
                 &projection_ptr);
    }
    else {
      pSegment_local = (Segment *)0xffffffffffffffff;
    }
  }
  else {
    pSegment_local = (Segment *)0xffffffffffffffff;
  }
  return (long)pSegment_local;
}

Assistant:

long VideoTrack::Parse(Segment* pSegment, const Info& info,
                       long long element_start, long long element_size,
                       VideoTrack*& pResult) {
  if (pResult)
    return -1;

  if (info.type != Track::kVideo)
    return -1;

  long long width = 0;
  long long height = 0;
  long long display_width = 0;
  long long display_height = 0;
  long long display_unit = 0;
  long long stereo_mode = 0;

  double rate = 0.0;
  char* colour_space = NULL;

  IMkvReader* const pReader = pSegment->m_pReader;

  const Settings& s = info.settings;
  assert(s.start >= 0);
  assert(s.size >= 0);

  long long pos = s.start;
  assert(pos >= 0);

  const long long stop = pos + s.size;

  std::unique_ptr<Colour> colour_ptr;
  std::unique_ptr<Projection> projection_ptr;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvPixelWidth) {
      width = UnserializeUInt(pReader, pos, size);

      if (width <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvPixelHeight) {
      height = UnserializeUInt(pReader, pos, size);

      if (height <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayWidth) {
      display_width = UnserializeUInt(pReader, pos, size);

      if (display_width <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayHeight) {
      display_height = UnserializeUInt(pReader, pos, size);

      if (display_height <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayUnit) {
      display_unit = UnserializeUInt(pReader, pos, size);

      if (display_unit < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvStereoMode) {
      stereo_mode = UnserializeUInt(pReader, pos, size);

      if (stereo_mode < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvFrameRate) {
      const long status = UnserializeFloat(pReader, pos, size, rate);

      if (status < 0)
        return status;

      if (rate <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvColour) {
      Colour* colour = NULL;
      if (!Colour::Parse(pReader, pos, size, &colour)) {
        return E_FILE_FORMAT_INVALID;
      } else {
        colour_ptr.reset(colour);
      }
    } else if (id == libwebm::kMkvProjection) {
      Projection* projection = NULL;
      if (!Projection::Parse(pReader, pos, size, &projection)) {
        return E_FILE_FORMAT_INVALID;
      } else {
        projection_ptr.reset(projection);
      }
    } else if (id == libwebm::kMkvColourSpace) {
      const long status = UnserializeString(pReader, pos, size, colour_space);
      if (status < 0)
        return status;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  VideoTrack* const pTrack =
      new (std::nothrow) VideoTrack(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {  // error
    delete pTrack;
    return status;
  }

  pTrack->m_width = width;
  pTrack->m_height = height;
  pTrack->m_display_width = display_width;
  pTrack->m_display_height = display_height;
  pTrack->m_display_unit = display_unit;
  pTrack->m_stereo_mode = stereo_mode;
  pTrack->m_rate = rate;
  pTrack->m_colour = colour_ptr.release();
  pTrack->m_colour_space = colour_space;
  pTrack->m_projection = projection_ptr.release();

  pResult = pTrack;
  return 0;  // success
}